

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphml.hpp
# Opt level: O0

void __thiscall bal::GraphMLStreamWriter::write_footer(GraphMLStreamWriter *this,Cnf *value)

{
  ostream *poVar1;
  Cnf *value_local;
  GraphMLStreamWriter *this_local;
  
  poVar1 = StreamWriter<bal::Cnf>::stream(&this->super_StreamWriter<bal::Cnf>);
  poVar1 = std::operator<<(poVar1,"</graph>");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = StreamWriter<bal::Cnf>::stream(&this->super_StreamWriter<bal::Cnf>);
  poVar1 = std::operator<<(poVar1,"</graphml>");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void write_footer(const Cnf& value) {
            stream() << "</graph>" << std::endl;
            stream() << "</graphml>" << std::endl;
        }